

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duck_index_entry.cpp
# Opt level: O2

void __thiscall
duckdb::DuckIndexEntry::DuckIndexEntry
          (DuckIndexEntry *this,Catalog *catalog,SchemaCatalogEntry *schema,
          CreateIndexInfo *create_info,TableCatalogEntry *table_p)

{
  int iVar1;
  undefined4 extraout_var;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1;
  shared_ptr<duckdb::DataTableInfo,_true> local_20;
  
  IndexCatalogEntry::IndexCatalogEntry(&this->super_IndexCatalogEntry,catalog,schema,create_info);
  (this->super_IndexCatalogEntry).super_StandardEntry.super_InCatalogEntry.super_CatalogEntry.
  _vptr_CatalogEntry = (_func_int **)&PTR__DuckIndexEntry_027a1b40;
  (this->info).internal.super___shared_ptr<duckdb::IndexDataTableInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (this->info).internal.super___shared_ptr<duckdb::IndexDataTableInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->initial_index_size = 0;
  iVar1 = (*(table_p->super_StandardEntry).super_InCatalogEntry.super_CatalogEntry.
            _vptr_CatalogEntry[0x10])(table_p);
  args_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           DataTable::GetDataTableInfo((DataTable *)CONCAT44(extraout_var,iVar1));
  make_shared_ptr<duckdb::IndexDataTableInfo,duckdb::shared_ptr<duckdb::DataTableInfo,true>&,std::__cxx11::string&>
            (&local_20,args_1);
  shared_ptr<duckdb::IndexDataTableInfo,_true>::operator=
            (&this->info,(shared_ptr<duckdb::IndexDataTableInfo,_true> *)&local_20);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_20.internal.
              super___shared_ptr<duckdb::DataTableInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

DuckIndexEntry::DuckIndexEntry(Catalog &catalog, SchemaCatalogEntry &schema, CreateIndexInfo &create_info,
                               TableCatalogEntry &table_p)
    : IndexCatalogEntry(catalog, schema, create_info), initial_index_size(0) {

	auto &table = table_p.Cast<DuckTableEntry>();
	auto &storage = table.GetStorage();
	info = make_shared_ptr<IndexDataTableInfo>(storage.GetDataTableInfo(), name);
}